

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

pair<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>,_bool>
* __thiscall
pstore::json::details::object_matcher<json_out_callbacks>::consume
          (pair<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>,_bool>
           *__return_storage_ptr__,object_matcher<json_out_callbacks> *this,
          parser<json_out_callbacks> *parser,maybe<char,_void> *ch)

{
  byte bVar1;
  int iVar2;
  _Head_base<0UL,_pstore::json::details::singleton_storage<json_out_callbacks>_*,_false> _Var3;
  bool bVar4;
  byte *pbVar5;
  ulong uVar6;
  matcher<json_out_callbacks> *pmVar7;
  error_code eVar8;
  error_code local_28;
  
  if ((this->super_matcher<json_out_callbacks>).state_ == 1) {
    if ((parser->error_)._M_value == 0) {
      assert_failed("parser.last_error ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/json/json.hpp"
                    ,0x4f6);
    }
    goto LAB_001324e2;
  }
  if (ch->valid_ == false) {
LAB_001324c5:
    local_28._M_cat = get_error_category();
    local_28._M_value = 7;
LAB_001324d3:
    matcher<json_out_callbacks>::set_error
              (&this->super_matcher<json_out_callbacks>,parser,&local_28);
    goto LAB_001324e2;
  }
  pbVar5 = (byte *)maybe<char,_void>::operator->(ch);
  iVar2 = (this->super_matcher<json_out_callbacks>).state_;
  if (6 < iVar2 - 1U) goto LAB_001324e2;
  bVar1 = *pbVar5;
  uVar6 = (ulong)bVar1;
  switch(iVar2) {
  case 1:
    assert_failed("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/json/json.hpp"
                  ,0x536);
  case 2:
    if (bVar1 != 0x7b) {
      assert_failed("c == \'{\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/json/json.hpp"
                    ,0x500);
    }
    (this->super_matcher<json_out_callbacks>).state_ = 3;
    eVar8 = json_out_callbacks::begin_object(&parser->callbacks_);
    local_28._M_cat = eVar8._M_cat;
    local_28._M_value = eVar8._M_value;
    bVar4 = matcher<json_out_callbacks>::set_error
                      (&this->super_matcher<json_out_callbacks>,parser,&local_28);
    if (bVar4) goto LAB_001324e2;
    _Var3._M_head_impl =
         (parser->singletons_)._M_t.
         super___uniq_ptr_impl<pstore::json::details::singleton_storage<json_out_callbacks>,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<json_out_callbacks>_*,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
         .
         super__Head_base<0UL,_pstore::json::details::singleton_storage<json_out_callbacks>_*,_false>
         ._M_head_impl;
    *(undefined4 *)((long)&(_Var3._M_head_impl)->terminal + 8) = 2;
    ((_Var3._M_head_impl)->terminal).__align =
         (anon_struct_8_0_00000001_for___align)&PTR__matcher_001a9cf0;
    local_28._M_value = (uint)local_28._M_value >> 8;
    (__return_storage_ptr__->first)._M_t.
    super___uniq_ptr_impl<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_pstore::json::details::matcher<json_out_callbacks>_*,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
    .
    super__Tuple_impl<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
    .
    super__Head_base<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>,_false>
         = (_Head_base<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>,_false>
            )0x0;
    (__return_storage_ptr__->first)._M_t.
    super___uniq_ptr_impl<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_pstore::json::details::matcher<json_out_callbacks>_*,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
    .super__Head_base<0UL,_pstore::json::details::matcher<json_out_callbacks>_*,_false>._M_head_impl
         = (matcher<json_out_callbacks> *)&(_Var3._M_head_impl)->terminal;
LAB_001324a8:
    local_28._M_value = local_28._M_value << 8;
    __return_storage_ptr__->second = true;
    goto LAB_00132459;
  case 3:
    if (bVar1 == 0x7d) goto LAB_001324b8;
  case 4:
    (this->super_matcher<json_out_callbacks>).state_ = 5;
    _Var3._M_head_impl =
         (parser->singletons_)._M_t.
         super___uniq_ptr_impl<pstore::json::details::singleton_storage<json_out_callbacks>,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<json_out_callbacks>_*,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
         .
         super__Head_base<0UL,_pstore::json::details::singleton_storage<json_out_callbacks>_*,_false>
         ._M_head_impl;
    pmVar7 = (matcher<json_out_callbacks> *)&(_Var3._M_head_impl)->root;
    *(undefined4 *)((long)&(_Var3._M_head_impl)->root + 8) = 2;
    ((_Var3._M_head_impl)->root).__align =
         (anon_struct_8_0_00000001_for___align)&PTR__matcher_001a9d30;
    *(undefined1 *)((long)&(_Var3._M_head_impl)->root + 0xc) = 1;
    break;
  case 5:
    if (0x3a < bVar1) {
LAB_001324ff:
      local_28._M_cat = get_error_category();
      local_28._M_value = 3;
      goto LAB_001324d3;
    }
    if ((0x100002600U >> (uVar6 & 0x3f) & 1) == 0) {
      if (uVar6 == 0x3a) {
        (this->super_matcher<json_out_callbacks>).state_ = 6;
        goto LAB_001324e2;
      }
      goto LAB_001324ff;
    }
LAB_0013242b:
    _Var3._M_head_impl =
         (parser->singletons_)._M_t.
         super___uniq_ptr_impl<pstore::json::details::singleton_storage<json_out_callbacks>,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<json_out_callbacks>_*,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
         .
         super__Head_base<0UL,_pstore::json::details::singleton_storage<json_out_callbacks>_*,_false>
         ._M_head_impl;
    pmVar7 = (matcher<json_out_callbacks> *)&(_Var3._M_head_impl)->terminal;
    *(undefined4 *)((long)&(_Var3._M_head_impl)->terminal + 8) = 2;
    ((_Var3._M_head_impl)->terminal).__align =
         (anon_struct_8_0_00000001_for___align)&PTR__matcher_001a9cf0;
    break;
  case 6:
    (this->super_matcher<json_out_callbacks>).state_ = 7;
    _Var3._M_head_impl =
         (parser->singletons_)._M_t.
         super___uniq_ptr_impl<pstore::json::details::singleton_storage<json_out_callbacks>,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<json_out_callbacks>_*,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
         .
         super__Head_base<0UL,_pstore::json::details::singleton_storage<json_out_callbacks>_*,_false>
         ._M_head_impl;
    *(undefined4 *)((long)&(_Var3._M_head_impl)->root + 8) = 2;
    ((_Var3._M_head_impl)->root).__align =
         (anon_struct_8_0_00000001_for___align)&PTR__matcher_001a9d30;
    *(undefined1 *)((long)&(_Var3._M_head_impl)->root + 0xc) = 0;
    local_28._M_value = (uint)local_28._M_value._1_3_ << 8;
    (__return_storage_ptr__->first)._M_t.
    super___uniq_ptr_impl<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_pstore::json::details::matcher<json_out_callbacks>_*,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
    .
    super__Tuple_impl<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
    .
    super__Head_base<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>,_false>
         = (_Head_base<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>,_false>
            )0x0;
    (__return_storage_ptr__->first)._M_t.
    super___uniq_ptr_impl<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_pstore::json::details::matcher<json_out_callbacks>_*,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
    .super__Head_base<0UL,_pstore::json::details::matcher<json_out_callbacks>_*,_false>._M_head_impl
         = (matcher<json_out_callbacks> *)&(_Var3._M_head_impl)->root;
    __return_storage_ptr__->second = false;
    goto LAB_00132459;
  case 7:
    if (bVar1 < 0x2d) {
      if ((0x100002600U >> (uVar6 & 0x3f) & 1) != 0) goto LAB_0013242b;
      if (uVar6 == 0x2c) {
        (this->super_matcher<json_out_callbacks>).state_ =
             ((parser->extensions_ & object_trailing_comma) == none) + 3;
        _Var3._M_head_impl =
             (parser->singletons_)._M_t.
             super___uniq_ptr_impl<pstore::json::details::singleton_storage<json_out_callbacks>,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<json_out_callbacks>_*,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
             .
             super__Head_base<0UL,_pstore::json::details::singleton_storage<json_out_callbacks>_*,_false>
             ._M_head_impl;
        *(undefined4 *)((long)&(_Var3._M_head_impl)->terminal + 8) = 2;
        ((_Var3._M_head_impl)->terminal).__align =
             (anon_struct_8_0_00000001_for___align)&PTR__matcher_001a9cf0;
        local_28._M_value = (int)local_28._M_value._1_3_;
        (__return_storage_ptr__->first)._M_t.
        super___uniq_ptr_impl<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_pstore::json::details::matcher<json_out_callbacks>_*,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
        .
        super__Tuple_impl<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
        .
        super__Head_base<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>,_false>
             = (_Head_base<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>,_false>
                )0x0;
        (__return_storage_ptr__->first)._M_t.
        super___uniq_ptr_impl<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_pstore::json::details::matcher<json_out_callbacks>_*,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
        .super__Head_base<0UL,_pstore::json::details::matcher<json_out_callbacks>_*,_false>.
        _M_head_impl = (matcher<json_out_callbacks> *)&(_Var3._M_head_impl)->terminal;
        goto LAB_001324a8;
      }
    }
    if (bVar1 != 0x7d) goto LAB_001324c5;
LAB_001324b8:
    end_object(this,parser);
LAB_001324e2:
    *(undefined8 *)
     &(__return_storage_ptr__->first)._M_t.
      super___uniq_ptr_impl<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_pstore::json::details::matcher<json_out_callbacks>_*,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
         = 1;
    (__return_storage_ptr__->first)._M_t.
    super___uniq_ptr_impl<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_pstore::json::details::matcher<json_out_callbacks>_*,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
    .super__Head_base<0UL,_pstore::json::details::matcher<json_out_callbacks>_*,_false>._M_head_impl
         = (matcher<json_out_callbacks> *)0x0;
    __return_storage_ptr__->second = true;
    return __return_storage_ptr__;
  }
  local_28._M_value = (uint)local_28._M_value._1_3_ << 8;
  (__return_storage_ptr__->first)._M_t.
  super___uniq_ptr_impl<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_pstore::json::details::matcher<json_out_callbacks>_*,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
  .
  super__Tuple_impl<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
  .
  super__Head_base<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>,_false>
       = (_Head_base<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>,_false>
          )0x0;
  (__return_storage_ptr__->first)._M_t.
  super___uniq_ptr_impl<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_pstore::json::details::matcher<json_out_callbacks>_*,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
  .super__Head_base<0UL,_pstore::json::details::matcher<json_out_callbacks>_*,_false>._M_head_impl =
       pmVar7;
  __return_storage_ptr__->second = false;
LAB_00132459:
  local_28._M_cat = (error_category *)0x0;
  std::
  unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
  ::~unique_ptr((unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
                 *)&local_28);
  return __return_storage_ptr__;
}

Assistant:

std::pair<typename matcher<Callbacks>::pointer, bool>
            object_matcher<Callbacks>::consume (parser<Callbacks> & parser, maybe<char> ch) {
                if (this->get_state () == done_state) {
                    PSTORE_ASSERT (parser.last_error ());
                    return {nullptr, true};
                }
                if (!ch) {
                    this->set_error (parser, error_code::expected_object_member);
                    return {nullptr, true};
                }
                char const c = *ch;
                switch (this->get_state ()) {
                case start_state:
                    PSTORE_ASSERT (c == '{');
                    this->set_state (first_key_state);
                    if (this->set_error (parser, parser.callbacks ().begin_object ())) {
                        break;
                    }
                    return {this->make_whitespace_matcher (parser), true};
                case first_key_state:
                    // We allow either a closing brace (to end the object) or a property name.
                    if (c == '}') {
                        this->end_object (parser);
                        break;
                    }
                    PSTORE_FALLTHROUGH;
                case key_state:
                    // Match a property name then expect a colon.
                    this->set_state (colon_state);
                    return {this->make_root_matcher (parser, true /*object key?*/), false};
                case colon_state:
                    if (isspace (c)) {
                        // just consume whitespace before the colon.
                        return {this->make_whitespace_matcher (parser), false};
                    }
                    if (c == ':') {
                        this->set_state (value_state);
                    } else {
                        this->set_error (parser, error_code::expected_colon);
                    }
                    break;
                case value_state:
                    this->set_state (comma_state);
                    return {this->make_root_matcher (parser), false};
                case comma_state:
                    if (isspace (c)) {
                        // just consume whitespace before the comma.
                        return {this->make_whitespace_matcher (parser), false};
                    }
                    if (c == ',') {
                        // Strictly conforming JSON requires a property name following a comma but
                        // we have an extension to allow an trailing comma which may be followed by
                        // the object's closing brace.
                        this->set_state (
                            (parser.extension_enabled (extensions::object_trailing_comma))
                                ? first_key_state
                                : key_state);
                        // Consume the comma and any whitespace before the close brace or property
                        // name.
                        return {this->make_whitespace_matcher (parser), true};
                    }
                    if (c == '}') {
                        this->end_object (parser);
                    } else {
                        this->set_error (parser, error_code::expected_object_member);
                    }
                    break;
                case done_state: PSTORE_ASSERT (false); break;
                }
                // No change of matcher. Consume the input character.
                return {nullptr, true};
            }